

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseExpression.cpp
# Opt level: O0

shared_ptr<Kandinsky::BaseExpression>
Kandinsky::BaseExpression::makePtr<Kandinsky::Variable>(Variable *arg)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<Kandinsky::BaseExpression> *in_RDI;
  shared_ptr<Kandinsky::BaseExpression> sVar1;
  Variable *in_stack_ffffffffffffffc8;
  shared_ptr<Kandinsky::BaseExpression> *this;
  
  this = in_RDI;
  Variable::getVariableExpressionPtr(in_stack_ffffffffffffffc8);
  std::shared_ptr<Kandinsky::BaseExpression>::shared_ptr<Kandinsky::VariableExpression,void>
            (this,(shared_ptr<Kandinsky::VariableExpression> *)in_stack_ffffffffffffffc8);
  std::shared_ptr<Kandinsky::VariableExpression>::~shared_ptr
            ((shared_ptr<Kandinsky::VariableExpression> *)0x11d2b3);
  sVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<Kandinsky::BaseExpression>)
         sVar1.super___shared_ptr<Kandinsky::BaseExpression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BaseExpression> BaseExpression::makePtr<Variable>(const Variable& arg)
    {
        return arg.getVariableExpressionPtr();
    }